

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O1

void opj_mct_decode(OPJ_INT32 *c0,OPJ_INT32 *c1,OPJ_INT32 *c2,OPJ_SIZE_T n)

{
  int *piVar1;
  int *piVar2;
  OPJ_INT32 *pOVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  uVar10 = 0;
  if ((n & 0xfffffffc) != 0) {
    do {
      piVar1 = c0 + uVar10;
      piVar2 = c1 + uVar10;
      iVar4 = *piVar2;
      iVar11 = piVar2[1];
      iVar5 = piVar2[2];
      iVar6 = piVar2[3];
      piVar2 = c2 + uVar10;
      iVar7 = piVar2[1];
      iVar8 = piVar2[2];
      iVar9 = piVar2[3];
      iVar12 = *piVar1 - (*piVar2 + iVar4 >> 2);
      iVar13 = piVar1[1] - (iVar7 + iVar11 >> 2);
      iVar14 = piVar1[2] - (iVar8 + iVar5 >> 2);
      iVar15 = piVar1[3] - (iVar9 + iVar6 >> 2);
      pOVar3 = c0 + uVar10;
      *pOVar3 = *piVar2 + iVar12;
      pOVar3[1] = iVar7 + iVar13;
      pOVar3[2] = iVar8 + iVar14;
      pOVar3[3] = iVar9 + iVar15;
      pOVar3 = c1 + uVar10;
      *pOVar3 = iVar12;
      pOVar3[1] = iVar13;
      pOVar3[2] = iVar14;
      pOVar3[3] = iVar15;
      pOVar3 = c2 + uVar10;
      *pOVar3 = iVar4 + iVar12;
      pOVar3[1] = iVar11 + iVar13;
      pOVar3[2] = iVar5 + iVar14;
      pOVar3[3] = iVar6 + iVar15;
      uVar10 = uVar10 + 4;
    } while (uVar10 < (n & 0xfffffffc));
  }
  if (uVar10 < n) {
    do {
      iVar4 = c1[uVar10];
      iVar11 = c0[uVar10] - (c2[uVar10] + iVar4 >> 2);
      c0[uVar10] = c2[uVar10] + iVar11;
      c1[uVar10] = iVar11;
      c2[uVar10] = iVar4 + iVar11;
      uVar10 = uVar10 + 1;
    } while (n != uVar10);
  }
  return;
}

Assistant:

void opj_mct_decode(
    OPJ_INT32* OPJ_RESTRICT c0,
    OPJ_INT32* OPJ_RESTRICT c1,
    OPJ_INT32* OPJ_RESTRICT c2,
    OPJ_SIZE_T n)
{
    OPJ_SIZE_T i;
    const OPJ_SIZE_T len = n;

    for (i = 0; i < (len & ~3U); i += 4) {
        __m128i r, g, b;
        __m128i y = _mm_load_si128((const __m128i *) & (c0[i]));
        __m128i u = _mm_load_si128((const __m128i *) & (c1[i]));
        __m128i v = _mm_load_si128((const __m128i *) & (c2[i]));
        g = y;
        g = _mm_sub_epi32(g, _mm_srai_epi32(_mm_add_epi32(u, v), 2));
        r = _mm_add_epi32(v, g);
        b = _mm_add_epi32(u, g);
        _mm_store_si128((__m128i *) & (c0[i]), r);
        _mm_store_si128((__m128i *) & (c1[i]), g);
        _mm_store_si128((__m128i *) & (c2[i]), b);
    }
    for (; i < len; ++i) {
        OPJ_INT32 y = c0[i];
        OPJ_INT32 u = c1[i];
        OPJ_INT32 v = c2[i];
        OPJ_INT32 g = y - ((u + v) >> 2);
        OPJ_INT32 r = v + g;
        OPJ_INT32 b = u + g;
        c0[i] = r;
        c1[i] = g;
        c2[i] = b;
    }
}